

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O1

void __thiscall
re2c::Cpgoto::Cpgoto
          (Cpgoto *this,Span *span,uint32_t nSpans,Span *hspan,uint32_t hSpans,State *next)

{
  SwitchIf *this_00;
  CpgotoTable *this_01;
  
  if (hSpans == 0) {
    this_00 = (SwitchIf *)0x0;
  }
  else {
    this_00 = (SwitchIf *)operator_new(0x10);
    SwitchIf::SwitchIf(this_00,hspan,hSpans,next);
  }
  this->hgo = this_00;
  this_01 = (CpgotoTable *)operator_new(8);
  CpgotoTable::CpgotoTable(this_01,span,nSpans);
  this->table = this_01;
  return;
}

Assistant:

Cpgoto::Cpgoto (const Span * span, uint32_t nSpans, const Span * hspan, uint32_t hSpans, const State * next)
	: hgo (hSpans == 0 ? NULL : new SwitchIf (hspan, hSpans, next))
	, table (new CpgotoTable (span, nSpans))
{}